

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint32_t arm_phys_excp_target_el_arm(CPUState *cs,uint32_t excp_idx,uint32_t cur_el,_Bool secure)

{
  char cVar1;
  CPUARMState *env;
  uint uVar2;
  uint64_t uVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  
  env = (CPUARMState *)cs->env_ptr;
  uVar6 = (uint)env->features & 0x10000000;
  uVar2 = uVar6 >> 0x1c;
  if ((env->features >> 0x21 & 1) != 0) {
    uVar6 = (uint)(env->cp15).scr_el3 & 0x400;
  }
  uVar3 = arm_hcr_el2_eff_arm(env);
  if (excp_idx == 5) {
    bVar5 = 4;
    iVar4 = 1;
  }
  else if (excp_idx == 6) {
    bVar5 = 3;
    iVar4 = 2;
  }
  else {
    bVar5 = 5;
    iVar4 = 3;
  }
  cVar1 = target_el_table[0][((byte)(env->cp15).scr_el3 >> iVar4 & 1) != 0][uVar6 != 0]
          [(uint)((((uint)uVar3 & 0xff) >> (uint)bVar5 & 1) != 0) | (uint)uVar3 >> 0x1b & 1][secure]
          [(ulong)cur_el + (ulong)(uVar2 << 6)];
  if ('\0' < cVar1) {
    return (int)cVar1;
  }
  __assert_fail("target_el > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                ,0x2008,
                "uint32_t arm_phys_excp_target_el_arm(CPUState *, uint32_t, uint32_t, _Bool)");
}

Assistant:

uint32_t arm_phys_excp_target_el(CPUState *cs, uint32_t excp_idx,
                                 uint32_t cur_el, bool secure)
{
    CPUARMState *env = cs->env_ptr;
    bool rw;
    bool scr;
    bool hcr;
    int target_el;
    /* Is the highest EL AArch64? */
    bool is64 = arm_feature(env, ARM_FEATURE_AARCH64);
    uint64_t hcr_el2;

    if (arm_feature(env, ARM_FEATURE_EL3)) {
        rw = ((env->cp15.scr_el3 & SCR_RW) == SCR_RW);
    } else {
        /* Either EL2 is the highest EL (and so the EL2 register width
         * is given by is64); or there is no EL2 or EL3, in which case
         * the value of 'rw' does not affect the table lookup anyway.
         */
        rw = is64;
    }

    hcr_el2 = arm_hcr_el2_eff(env);
    switch (excp_idx) {
    case EXCP_IRQ:
        scr = ((env->cp15.scr_el3 & SCR_IRQ) == SCR_IRQ);
        hcr = hcr_el2 & HCR_IMO;
        break;
    case EXCP_FIQ:
        scr = ((env->cp15.scr_el3 & SCR_FIQ) == SCR_FIQ);
        hcr = hcr_el2 & HCR_FMO;
        break;
    default:
        scr = ((env->cp15.scr_el3 & SCR_EA) == SCR_EA);
        hcr = hcr_el2 & HCR_AMO;
        break;
    };

    /*
     * For these purposes, TGE and AMO/IMO/FMO both force the
     * interrupt to EL2.  Fold TGE into the bit extracted above.
     */
    hcr |= (hcr_el2 & HCR_TGE) != 0;

    /* Perform a table-lookup for the target EL given the current state */
    target_el = target_el_table[is64][scr][rw][hcr][secure][cur_el];

    assert(target_el > 0);

    return target_el;
}